

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test.cpp
# Opt level: O0

int main(void)

{
  allocator<int> *this;
  initializer_list<int> __l;
  initializer_list<uInputPlus::uInputAbsSetup> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  undefined1 local_6c0 [8];
  uInput myinput;
  set<int,_std::less<int>,_std::allocator<int>_> local_680;
  allocator<uInputPlus::uInputAbsSetup> local_649;
  uInputAbsSetup local_648;
  uInputAbsSetup local_5f0;
  uInputAbsSetup local_598;
  uInputAbsSetup local_540;
  uInputAbsSetup local_4e8;
  uInputAbsSetup local_490;
  uInputAbsSetup local_438;
  uInputAbsSetup local_3e0;
  uInputAbsSetup local_388;
  iterator local_330;
  size_type local_328;
  vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_> local_320;
  set<int,_std::less<int>,_std::allocator<int>_> local_308;
  allocator<int> local_2ca;
  less<int> local_2c9;
  int local_2c8 [8];
  iterator local_2a8;
  size_type local_2a0;
  set<int,_std::less<int>,_std::allocator<int>_> local_298;
  allocator<int> local_262;
  less<int> local_261;
  int local_260 [2];
  iterator local_258;
  size_type local_250;
  set<int,_std::less<int>,_std::allocator<int>_> local_248;
  allocator local_201;
  string local_200 [32];
  uInputDeviceInfo local_1e0;
  undefined1 local_160 [8];
  uInputSetup mysetup;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_200,anon_var_dwarf_30b1,&local_201);
  uInputPlus::uInputDeviceInfo::uInputDeviceInfo
            (&local_1e0,(string *)local_200,3,0x2333,0x6666,0x5b25);
  local_260[0] = 1;
  local_260[1] = 3;
  local_258 = local_260;
  local_250 = 2;
  std::allocator<int>::allocator(&local_262);
  __l_02._M_len = local_250;
  __l_02._M_array = local_258;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_248,__l_02,&local_261,&local_262);
  local_2c8[4] = 0x14a;
  local_2c8[5] = 0x14d;
  local_2c8[6] = 0x14e;
  local_2c8[7] = 0x14f;
  local_2c8[0] = 0x110;
  local_2c8[1] = 0x111;
  local_2c8[2] = 0x145;
  local_2c8[3] = 0x148;
  local_2a8 = local_2c8;
  local_2a0 = 8;
  std::allocator<int>::allocator(&local_2ca);
  __l_01._M_len = local_2a0;
  __l_01._M_array = local_2a8;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_298,__l_01,&local_2c9,&local_2ca);
  local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  local_308._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  local_308._M_t._M_impl._0_8_ = 0;
  local_308._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  local_308._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = 0;
  std::set<int,_std::less<int>,_std::allocator<int>_>::set(&local_308);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_648,0,6000,0x28);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_5f0,1,6000,0x28);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_598,0x18,0xff);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_540,0x1c,0xf);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_4e8,0x2f,1);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_490,0x35,6000,0x28);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_438,0x36,6000,0x28);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_3e0,0x39,0xffff);
  uInputPlus::uInputAbsSetup::uInputAbsSetup(&local_388,0x3a,0xff);
  local_330 = &local_648;
  local_328 = 9;
  std::allocator<uInputPlus::uInputAbsSetup>::allocator(&local_649);
  __l_00._M_len = local_328;
  __l_00._M_array = local_330;
  std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>::vector
            (&local_320,__l_00,&local_649);
  myinput.custom_callback_._M_invoker._4_4_ = 0;
  this = (allocator<int> *)((long)&myinput.custom_callback_._M_invoker + 2);
  std::allocator<int>::allocator(this);
  __l._M_len = 1;
  __l._M_array = (iterator)((long)&myinput.custom_callback_._M_invoker + 4);
  std::set<int,_std::less<int>,_std::allocator<int>_>::set
            (&local_680,__l,(less<int> *)((long)&myinput.custom_callback_._M_invoker + 3),this);
  uInputPlus::uInputSetup::uInputSetup
            ((uInputSetup *)local_160,&local_1e0,&local_248,&local_298,&local_308,&local_320,
             &local_680);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_680);
  std::allocator<int>::~allocator
            ((allocator<int> *)((long)&myinput.custom_callback_._M_invoker + 2));
  std::vector<uInputPlus::uInputAbsSetup,_std::allocator<uInputPlus::uInputAbsSetup>_>::~vector
            (&local_320);
  std::allocator<uInputPlus::uInputAbsSetup>::~allocator(&local_649);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_308);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_298);
  std::allocator<int>::~allocator(&local_2ca);
  std::set<int,_std::less<int>,_std::allocator<int>_>::~set(&local_248);
  std::allocator<int>::~allocator(&local_262);
  std::__cxx11::string::~string(local_200);
  std::allocator<char>::~allocator((allocator<char> *)&local_201);
  uInputPlus::uInput::uInput((uInput *)local_6c0,(uInputSetup *)local_160);
  sleep(10);
  uInputPlus::uInput::emulate_touchpad_scroll((uInput *)local_6c0,-4000,true);
  uInputPlus::uInput::~uInput((uInput *)local_6c0);
  uInputPlus::uInputSetup::~uInputSetup((uInputSetup *)local_160);
  return 0;
}

Assistant:

int main() {

	uInputSetup mysetup(
		{"呀"},
		{EV_KEY, EV_ABS},
		{BTN_LEFT, BTN_RIGHT, BTN_TOOL_FINGER, BTN_TOOL_QUINTTAP, BTN_TOUCH, BTN_TOOL_DOUBLETAP, BTN_TOOL_TRIPLETAP, BTN_TOOL_QUADTAP},
		{},
		{
			{ABS_X, 6000, 40},
			{ABS_Y, 6000, 40},
			{ABS_PRESSURE, 255},
			{ABS_TOOL_WIDTH, 15},
			{ABS_MT_SLOT, 1},
			{ABS_MT_POSITION_X, 6000, 40},
			{ABS_MT_POSITION_Y, 6000, 40},
			{ABS_MT_TRACKING_ID, 65535},
			{ABS_MT_PRESSURE, 255}
		},
		{INPUT_PROP_POINTER}
	);

	uInput myinput(mysetup);

	sleep(10);

//	myinput.SendKeyPress({KEY_2, KEY_3, KEY_3, KEY_6, KEY_6, KEY_6});
//	myinput.SendKeyPress({{KEY_1, 1000}, {KEY_2, 600}});


	myinput.emulate_touchpad_scroll(-4000);
//	int i = 600;
//
//	while (i--) {
////		myinput.RelativeWheel(1);
//		myinput.AbsoluteWheel(1);
//		//myinput.RelativeMove({10, 10});
//		usleep(1000*16);
//	}


}